

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

int userkey_parse_line_counter(char *text)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  char *endptr;
  
  uVar3 = strtoul(text,&endptr,10);
  if (*text == '\0') {
    uVar2 = 0xffffffff;
  }
  else {
    uVar1 = 0xffffffffffffffff;
    if (uVar3 < 0x1555) {
      uVar1 = uVar3;
    }
    uVar2 = -(uint)(*endptr != '\0') | (uint)uVar1;
  }
  return uVar2;
}

Assistant:

static int userkey_parse_line_counter(const char *text)
{
    char *endptr;
    unsigned long ul = strtoul(text, &endptr, 10);
    if (*text && !*endptr && ul < MAX_KEY_BLOB_LINES)
        return ul;
    else
        return -1;
}